

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFAcceleratorTable.cpp
# Opt level: O3

void __thiscall
llvm::DWARFDebugNames::NameIndex::dumpName
          (NameIndex *this,ScopedPrinter *W,NameTableEntry *NTE,Optional<unsigned_int> Hash)

{
  StringRef N;
  NodeKind LHSKind;
  bool bVar1;
  raw_ostream *prVar2;
  char *Str;
  Child RHS;
  Child LHS;
  StringRef Label;
  StringRef Str_00;
  StringRef Str_01;
  Child local_90;
  NodeKind local_80;
  char local_7f;
  undefined **local_78;
  uint64_t EntryOffset;
  undefined8 local_68;
  Child local_58;
  undefined8 uStack_50;
  undefined2 local_48;
  DelimitedScope<___,____> local_38;
  DictScope NameScope;
  
  Twine::Twine((Twine *)&local_90,"Name ");
  RHS._4_4_ = 0;
  RHS.decUI = NTE->Index;
  if (local_80 == EmptyKind) {
    uStack_50 = 0;
    local_48 = 0x109;
    local_58 = RHS;
  }
  else if (local_80 == NullKind) {
    local_58.twine = (Twine *)0x0;
    uStack_50 = 0;
    local_48 = 0x100;
  }
  else {
    LHS.twine = (Twine *)&local_90;
    LHSKind = TwineKind;
    if (local_7f == '\x01') {
      LHS = local_90;
      LHSKind = local_80;
    }
    Twine::Twine((Twine *)&local_58,LHS,LHSKind,RHS,DecUIKind);
  }
  Twine::str_abi_cxx11_((string *)&stack0xffffffffffffff88,(Twine *)&local_58);
  N.Length = EntryOffset;
  N.Data = (char *)local_78;
  DelimitedScope<'{',_'}'>::DelimitedScope(&local_38,W,N);
  if (local_78 != (undefined **)&stack0xffffffffffffff98) {
    operator_delete(local_78,local_68 + 1);
  }
  if (((ulong)Hash.Storage >> 0x20 & 1) != 0) {
    Label.Length = 4;
    Label.Data = "Hash";
    ScopedPrinter::printHex<unsigned_int>(W,Label,Hash.Storage.field_0.value);
  }
  ScopedPrinter::printIndent(W);
  local_68 = NTE->StringOffset;
  EntryOffset = (uint64_t)anon_var_dwarf_317a264;
  local_78 = &PTR_home_00d77818;
  raw_ostream::operator<<(W->OS,(format_object_base *)&stack0xffffffffffffff88);
  Str_00.Length = 2;
  Str_00.Data = " \"";
  prVar2 = raw_ostream::operator<<(W->OS,Str_00);
  local_78 = (undefined **)NTE->StringOffset;
  Str = DataExtractor::getCStr(&NTE->StrData,(uint64_t *)&stack0xffffffffffffff88);
  prVar2 = raw_ostream::operator<<(prVar2,Str);
  Str_01.Length = 2;
  Str_01.Data = "\"\n";
  raw_ostream::operator<<(prVar2,Str_01);
  local_78 = (undefined **)NTE->EntryOffset;
  do {
    bVar1 = dumpEntry(this,W,(uint64_t *)&stack0xffffffffffffff88);
  } while (bVar1);
  DelimitedScope<'{',_'}'>::~DelimitedScope(&local_38);
  return;
}

Assistant:

void DWARFDebugNames::NameIndex::dumpName(ScopedPrinter &W,
                                          const NameTableEntry &NTE,
                                          Optional<uint32_t> Hash) const {
  DictScope NameScope(W, ("Name " + Twine(NTE.getIndex())).str());
  if (Hash)
    W.printHex("Hash", *Hash);

  W.startLine() << format("String: 0x%08" PRIx64, NTE.getStringOffset());
  W.getOStream() << " \"" << NTE.getString() << "\"\n";

  uint64_t EntryOffset = NTE.getEntryOffset();
  while (dumpEntry(W, &EntryOffset))
    /*empty*/;
}